

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testThreads.c
# Opt level: O1

void * thread_specific_data(void *private_data)

{
  char *__s1;
  undefined8 uVar1;
  int iVar2;
  uint *puVar3;
  undefined8 *puVar4;
  long lVar5;
  int *piVar6;
  long *plVar7;
  uint uVar8;
  
  __s1 = *private_data;
  iVar2 = strcmp(__s1,"test/threads/invalid.xml");
  puVar3 = (uint *)__xmlDoValidityCheckingDefaultValue();
  *puVar3 = (uint)(iVar2 != 0);
  if (iVar2 == 0) {
    puVar4 = (undefined8 *)&stdout;
  }
  else {
    puVar4 = (undefined8 *)&stderr;
  }
  uVar1 = *puVar4;
  puVar4 = (undefined8 *)__xmlGenericErrorContext();
  *puVar4 = uVar1;
  lVar5 = xmlParseFile(__s1);
  if (lVar5 == 0) {
    puts("parse failed");
  }
  else {
    xmlFreeDoc(lVar5);
  }
  uVar8 = (uint)(lVar5 != 0);
  iVar2 = strcmp(__s1,"test/threads/invalid.xml");
  piVar6 = (int *)__xmlDoValidityCheckingDefaultValue();
  if (iVar2 == 0) {
    if (*piVar6 != 0) {
      puts("ValidityCheckingDefaultValue override failed");
      uVar8 = 0;
    }
    plVar7 = (long *)__xmlGenericErrorContext();
    lVar5 = *plVar7;
    plVar7 = (long *)&stdout;
  }
  else {
    if (*piVar6 != 1) {
      puts("ValidityCheckingDefaultValue override failed");
      uVar8 = 0;
    }
    plVar7 = (long *)__xmlGenericErrorContext();
    lVar5 = *plVar7;
    plVar7 = (long *)&stderr;
  }
  if (lVar5 != *plVar7) {
    puts("xmlGenericErrorContext override failed");
    uVar8 = 0;
  }
  *(uint *)((long)private_data + 8) = uVar8;
  return (void *)0x0;
}

Assistant:

static void *
thread_specific_data(void *private_data)
{
    xmlDocPtr myDoc;
    xmlThreadParams *params = (xmlThreadParams *) private_data;
    const char *filename = params->filename;
    int okay = 1;

    if (!strcmp(filename, "test/threads/invalid.xml")) {
        xmlDoValidityCheckingDefaultValue = 0;
        xmlGenericErrorContext = stdout;
    } else {
        xmlDoValidityCheckingDefaultValue = 1;
        xmlGenericErrorContext = stderr;
    }
#ifdef LIBXML_SAX1_ENABLED
    myDoc = xmlParseFile(filename);
#else
    myDoc = xmlReadFile(filename, NULL, XML_WITH_CATALOG);
#endif
    if (myDoc) {
        xmlFreeDoc(myDoc);
    } else {
        printf("parse failed\n");
	okay = 0;
    }
    if (!strcmp(filename, "test/threads/invalid.xml")) {
        if (xmlDoValidityCheckingDefaultValue != 0) {
	    printf("ValidityCheckingDefaultValue override failed\n");
	    okay = 0;
	}
        if (xmlGenericErrorContext != stdout) {
	    printf("xmlGenericErrorContext override failed\n");
	    okay = 0;
	}
    } else {
        if (xmlDoValidityCheckingDefaultValue != 1) {
	    printf("ValidityCheckingDefaultValue override failed\n");
	    okay = 0;
	}
        if (xmlGenericErrorContext != stderr) {
	    printf("xmlGenericErrorContext override failed\n");
	    okay = 0;
	}
    }
    params->okay = okay;
    return(NULL);
}